

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void free_handshake_space(st_quicly_handshake_space_t **space)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    if (*(long *)(*in_RDI + 0x48) != 0) {
      dispose_cipher((st_quicly_cipher_context_t *)0x12f80d);
    }
    if (*(long *)(*in_RDI + 0x58) != 0) {
      dispose_cipher((st_quicly_cipher_context_t *)0x12f82f);
    }
    do_free_pn_space((st_quicly_pn_space_t *)0x12f83b);
    *in_RDI = 0;
  }
  return;
}

Assistant:

static void free_handshake_space(struct st_quicly_handshake_space_t **space)
{
    if (*space != NULL) {
        if ((*space)->cipher.ingress.aead != NULL)
            dispose_cipher(&(*space)->cipher.ingress);
        if ((*space)->cipher.egress.aead != NULL)
            dispose_cipher(&(*space)->cipher.egress);
        do_free_pn_space(&(*space)->super);
        *space = NULL;
    }
}